

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
     TraceFixedFieldsBeforeSetIsProto
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  char16_t *pcVar2;
  Type pcVar3;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,FixMethodPropsPhase);
  if ((bVar1) && (DAT_0145948a == '\x01')) {
    pcVar3 = (Type)0x0;
    Output::Print(L"FixedFields: PathTypeHandler::SetIsPrototype(0x%p):\n",instance);
    if (oldSingletonInstanceBefore != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar3 = (oldSingletonInstanceBefore->super_RecyclerWeakReferenceBase).strongRef;
    }
    Output::Print(L"   before: type = 0x%p, old singleton: 0x%p(0x%p)\n",oldType,
                  oldSingletonInstanceBefore,pcVar3);
    Output::Print(L"   fixed fields:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])(oldTypeHandler);
    Output::Print(L"\n");
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,FixMethodPropsPhase);
  if ((bVar1) && (DAT_0145948a == '\x01')) {
    Output::Print(L"FixedFields: PathTypeHandler::SetIsPrototype():\n");
    pcVar2 = L"!=";
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar2 = L"==";
    }
    Output::Print(L"   old singleton before %s null \n",pcVar2);
    Output::Print(L"   fixed fields before:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])(oldTypeHandler);
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TraceFixedFieldsBeforeSetIsProto(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: PathTypeHandler::SetIsPrototype(0x%p):\n"), instance);
            Output::Print(_u("   before: type = 0x%p, old singleton: 0x%p(0x%p)\n"),
                oldType, oldSingletonInstanceBefore, oldSingletonInstanceBefore != nullptr ? oldSingletonInstanceBefore->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: PathTypeHandler::SetIsPrototype():\n"));
            Output::Print(_u("   old singleton before %s null \n"), oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields before:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
    }